

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall p2t::Sweep::Fill(Sweep *this,SweepContext *tcx,Node *node)

{
  bool bVar1;
  Triangle *this_00;
  
  this_00 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(this_00,node->prev->point,node->point,node->next->point);
  Triangle::MarkNeighbor(this_00,node->prev->triangle);
  Triangle::MarkNeighbor(this_00,node->triangle);
  SweepContext::AddToMap(tcx,this_00);
  node->prev->next = node->next;
  node->next->prev = node->prev;
  bVar1 = Legalize(this,tcx,this_00);
  if (bVar1) {
    return;
  }
  SweepContext::MapTriangleToNodes(tcx,this_00);
  return;
}

Assistant:

void Sweep::Fill(SweepContext& tcx, Node& node)
{
  Triangle* triangle = new Triangle(*node.prev->point, *node.point, *node.next->point);

  // TODO: should copy the constrained_edge value from neighbor triangles
  //       for now constrained_edge values are copied during the legalize
  triangle->MarkNeighbor(*node.prev->triangle);
  triangle->MarkNeighbor(*node.triangle);

  tcx.AddToMap(triangle);

  // Update the advancing front
  node.prev->next = node.next;
  node.next->prev = node.prev;

  // If it was legalized the triangle has already been mapped
  if (!Legalize(tcx, *triangle)) {
    tcx.MapTriangleToNodes(*triangle);
  }

}